

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O2

void anon_unknown.dwarf_4654::Test_TemplateTestUtilTest_GetSectionDictionaries::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  int iVar10;
  byte *pbVar11;
  uint uVar12;
  char *pcVar13;
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  dicts;
  TemplateDictionaryPeer peer;
  TemplateDictionaryPeer peer_section;
  TemplateString local_1c8;
  TemplateDictionaryPeer peer_section1;
  TemplateString local_1a0;
  TemplateString local_180;
  TemplateString local_160;
  TemplateString local_140;
  TemplateString local_120;
  TemplateString local_100;
  TemplateString local_e0;
  TemplateString local_c0;
  TemplateString local_a0;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_1c8,"test_GetSectionDictionaries");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_1c8,(UnsafeArena *)0x0);
  dicts.
  super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dicts.
  super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dicts.
  super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.ptr_ = (char *)0x0;
  peer.dict_ = &dict;
  std::
  vector<ctemplate::TemplateDictionary_const*,std::allocator<ctemplate::TemplateDictionary_const*>>
  ::emplace_back<ctemplate::TemplateDictionary_const*>
            ((vector<ctemplate::TemplateDictionary_const*,std::allocator<ctemplate::TemplateDictionary_const*>>
              *)&dicts,(TemplateDictionary **)&local_1c8);
  ctemplate::TemplateString::TemplateString(&local_1c8,"SECTION");
  iVar10 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries(&peer,&local_1c8,&dicts);
  if (iVar10 == 0) {
    if (dicts.
        super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        dicts.
        super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
      ::~_Vector_base(&dicts.
                       super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                     );
      ctemplate::TemplateString::TemplateString(&local_a0,"SECTION");
      TVar1.length_ = local_a0.length_;
      TVar1.ptr_ = local_a0.ptr_;
      TVar1.is_immutable_ = local_a0.is_immutable_;
      TVar1._17_7_ = local_a0._17_7_;
      TVar1.id_ = local_a0.id_;
      ctemplate::TemplateDictionary::AddSectionDictionary(TVar1);
      ctemplate::TemplateString::TemplateString(&local_c0,"SECTION_VALUE");
      ctemplate::TemplateString::TemplateString(&local_e0,"0");
      TVar2.length_ = local_c0.length_;
      TVar2.ptr_ = local_c0.ptr_;
      TVar2.is_immutable_ = local_c0.is_immutable_;
      TVar2._17_7_ = local_c0._17_7_;
      TVar2.id_ = local_c0.id_;
      TVar7.length_ = local_e0.length_;
      TVar7.ptr_ = local_e0.ptr_;
      TVar7.is_immutable_ = local_e0.is_immutable_;
      TVar7._17_7_ = local_e0._17_7_;
      TVar7.id_ = local_e0.id_;
      ctemplate::TemplateDictionary::SetValue(TVar2,TVar7);
      dicts.
      super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dicts.
      super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      dicts.
      super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      peer.dict_ = &dict;
      ctemplate::TemplateString::TemplateString(&local_1c8,"SECTION");
      iVar10 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries(&peer,&local_1c8,&dicts);
      if (iVar10 != 1) {
        pcVar13 = "1";
        goto LAB_00107e7e;
      }
      peer_section.dict_ =
           *dicts.
            super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
      ctemplate::TemplateString::TemplateString(&local_1c8,"SECTION_VALUE");
      pbVar11 = (byte *)ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer_section,&local_1c8)
      ;
      uVar12 = *pbVar11 - 0x30;
      if (uVar12 == 0) {
        uVar12 = (uint)pbVar11[1];
      }
      if (uVar12 == 0) {
        std::
        _Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
        ::~_Vector_base(&dicts.
                         super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       );
        ctemplate::TemplateString::TemplateString(&local_100,"SECTION");
        TVar3.length_ = local_100.length_;
        TVar3.ptr_ = local_100.ptr_;
        TVar3.is_immutable_ = local_100.is_immutable_;
        TVar3._17_7_ = local_100._17_7_;
        TVar3.id_ = local_100.id_;
        ctemplate::TemplateDictionary::AddSectionDictionary(TVar3);
        ctemplate::TemplateString::TemplateString(&local_120,"SECTION_VALUE");
        ctemplate::TemplateString::TemplateString(&local_140,"1");
        TVar4.length_ = local_120.length_;
        TVar4.ptr_ = local_120.ptr_;
        TVar4.is_immutable_ = local_120.is_immutable_;
        TVar4._17_7_ = local_120._17_7_;
        TVar4.id_ = local_120.id_;
        TVar8.length_ = local_140.length_;
        TVar8.ptr_ = local_140.ptr_;
        TVar8.is_immutable_ = local_140.is_immutable_;
        TVar8._17_7_ = local_140._17_7_;
        TVar8.id_ = local_140.id_;
        ctemplate::TemplateDictionary::SetValue(TVar4,TVar8);
        ctemplate::TemplateString::TemplateString(&local_160,"ANOTHER_SECTION");
        TVar5.length_ = local_160.length_;
        TVar5.ptr_ = local_160.ptr_;
        TVar5.is_immutable_ = local_160.is_immutable_;
        TVar5._17_7_ = local_160._17_7_;
        TVar5.id_ = local_160.id_;
        ctemplate::TemplateDictionary::AddSectionDictionary(TVar5);
        ctemplate::TemplateString::TemplateString(&local_180,"ANOTHER_VALUE");
        ctemplate::TemplateString::TemplateString(&local_1a0,"2");
        TVar6.length_ = local_180.length_;
        TVar6.ptr_ = local_180.ptr_;
        TVar6.is_immutable_ = local_180.is_immutable_;
        TVar6._17_7_ = local_180._17_7_;
        TVar6.id_ = local_180.id_;
        TVar9.length_ = local_1a0.length_;
        TVar9.ptr_ = local_1a0.ptr_;
        TVar9.is_immutable_ = local_1a0.is_immutable_;
        TVar9._17_7_ = local_1a0._17_7_;
        TVar9.id_ = local_1a0.id_;
        ctemplate::TemplateDictionary::SetValue(TVar6,TVar9);
        dicts.
        super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        dicts.
        super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        dicts.
        super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        peer.dict_ = &dict;
        ctemplate::TemplateString::TemplateString(&local_1c8,"SECTION");
        iVar10 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries(&peer,&local_1c8,&dicts);
        if (iVar10 != 2) {
          pcVar13 = "2";
          goto LAB_00107e7e;
        }
        peer_section.dict_ =
             *dicts.
              super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
        ctemplate::TemplateString::TemplateString(&local_1c8,"SECTION_VALUE");
        pbVar11 = (byte *)ctemplate::TemplateDictionaryPeer::GetSectionValue
                                    (&peer_section,&local_1c8);
        uVar12 = *pbVar11 - 0x30;
        if (uVar12 == 0) {
          uVar12 = (uint)pbVar11[1];
        }
        if (uVar12 == 0) {
          peer_section1.dict_ =
               dicts.
               super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
          ctemplate::TemplateString::TemplateString(&local_1c8,"SECTION_VALUE");
          pbVar11 = (byte *)ctemplate::TemplateDictionaryPeer::GetSectionValue
                                      (&peer_section1,&local_1c8);
          uVar12 = *pbVar11 - 0x31;
          if (uVar12 == 0) {
            uVar12 = (uint)pbVar11[1];
          }
          if (uVar12 == 0) {
            std::
            _Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            ::~_Vector_base(&dicts.
                             super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                           );
            ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
            return;
          }
          pcVar13 = "strcmp(\"1\", peer_section1.GetSectionValue(\"SECTION_VALUE\")) == 0";
        }
        else {
          pcVar13 = "strcmp(\"0\", peer_section0.GetSectionValue(\"SECTION_VALUE\")) == 0";
        }
      }
      else {
        pcVar13 = "strcmp(\"0\", peer_section.GetSectionValue(\"SECTION_VALUE\")) == 0";
      }
    }
    else {
      pcVar13 = "dicts.empty()";
    }
    fprintf(_stderr,"Check failed: %s\n",pcVar13);
  }
  else {
    pcVar13 = "0";
LAB_00107e7e:
    fprintf(_stderr,"Check failed: %s %s %s\n",pcVar13,"==",
            "peer.GetSectionDictionaries(\"SECTION\", &dicts)");
  }
  exit(1);
}

Assistant:

TEST(TemplateTestUtilTest, GetSectionDictionaries) {
  TemplateDictionary dict("test_GetSectionDictionaries");

  {
    TemplateDictionaryPeer peer(&dict);
    vector<const TemplateDictionary*> dicts;
    // Add some dummy value into the vector to confirm that the call to
    // GetSectionDictionaries will correctly clear the vector.
    dicts.push_back(NULL);
    EXPECT_EQ(0, peer.GetSectionDictionaries("SECTION", &dicts));
    EXPECT_TRUE(dicts.empty());
  }

  dict.AddSectionDictionary("SECTION")->SetValue("SECTION_VALUE", "0");

  {
    TemplateDictionaryPeer peer(&dict);
    vector<const TemplateDictionary*> dicts;
    ASSERT_EQ(1, peer.GetSectionDictionaries("SECTION", &dicts));

    TemplateDictionaryPeer peer_section(dicts[0]);
    EXPECT_STREQ("0", peer_section.GetSectionValue("SECTION_VALUE"));
  }

  dict.AddSectionDictionary("SECTION")->SetValue("SECTION_VALUE", "1");
  dict.AddSectionDictionary("ANOTHER_SECTION")->SetValue("ANOTHER_VALUE", "2");

  {
    TemplateDictionaryPeer peer(&dict);
    vector<const TemplateDictionary*> dicts;
    ASSERT_EQ(2, peer.GetSectionDictionaries("SECTION", &dicts));

    TemplateDictionaryPeer peer_section0(dicts[0]);
    EXPECT_STREQ("0", peer_section0.GetSectionValue("SECTION_VALUE"));

    TemplateDictionaryPeer peer_section1(dicts[1]);
    EXPECT_STREQ("1", peer_section1.GetSectionValue("SECTION_VALUE"));
  }
}